

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

AssertionResult
testing::internal::HasOneFailure
          (char *param_1,char *param_2,char *param_3,TestPartResultArray *results,Type type,
          string *substr)

{
  TestPartResultArray *this;
  TestPartResult *pTVar1;
  AssertionResult *pAVar2;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  extraout_RDX;
  int i;
  int index;
  char *pcVar3;
  undefined4 in_register_00000084;
  AssertionResult AVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000008;
  Message msg;
  AssertionResult local_58;
  string expected;
  
  this = (TestPartResultArray *)CONCAT44(in_register_00000084,type);
  pcVar3 = "1 non-fatal failure";
  if ((Type)substr == kFatalFailure) {
    pcVar3 = "1 fatal failure";
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&expected,pcVar3,(allocator<char> *)&local_58);
  Message::Message(&msg);
  if ((int)((*(long *)(this + 8) - *(long *)this) / 0x70) == 1) {
    pTVar1 = TestPartResultArray::GetTestPartResult(this,0);
    if (pTVar1->type_ == (Type)substr) {
      pcVar3 = strstr((pTVar1->message_)._M_dataplus._M_p,(in_stack_00000008->_M_dataplus)._M_p);
      if (pcVar3 != (char *)0x0) {
        *param_1 = '\x01';
        param_1[8] = '\0';
        param_1[9] = '\0';
        param_1[10] = '\0';
        param_1[0xb] = '\0';
        param_1[0xc] = '\0';
        param_1[0xd] = '\0';
        param_1[0xe] = '\0';
        param_1[0xf] = '\0';
        goto LAB_00110ceb;
      }
      local_58.success_ = false;
      local_58.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      pAVar2 = AssertionResult::operator<<(&local_58,(char (*) [11])0x128ff1);
      pAVar2 = AssertionResult::operator<<(pAVar2,&expected);
      pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [14])" containing \"");
      pAVar2 = AssertionResult::operator<<(pAVar2,in_stack_00000008);
      pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [3])0x12979d);
      pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [11])"  Actual:\n");
      pAVar2 = AssertionResult::operator<<(pAVar2,pTVar1);
      AssertionResult::AssertionResult((AssertionResult *)param_1,pAVar2);
    }
    else {
      local_58.success_ = false;
      local_58.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      pAVar2 = AssertionResult::operator<<(&local_58,(char (*) [11])0x128ff1);
      pAVar2 = AssertionResult::operator<<(pAVar2,&expected);
      pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [2])0x1296e6);
      pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [11])"  Actual:\n");
      pAVar2 = AssertionResult::operator<<(pAVar2,pTVar1);
      AssertionResult::AssertionResult((AssertionResult *)param_1,pAVar2);
    }
  }
  else {
    std::operator<<((ostream *)((long)msg.ss_.ptr_ + 0x10),"Expected: ");
    std::operator<<((ostream *)((long)msg.ss_.ptr_ + 0x10),(string *)&expected);
    std::operator<<((ostream *)((long)msg.ss_.ptr_ + 0x10),"\n");
    std::operator<<((ostream *)((long)msg.ss_.ptr_ + 0x10),"  Actual: ");
    std::ostream::operator<<
              ((void *)((long)msg.ss_.ptr_ + 0x10),
               (int)((*(long *)(this + 8) - *(long *)this) / 0x70));
    std::operator<<((ostream *)((long)msg.ss_.ptr_ + 0x10)," failures");
    for (index = 0; index < (int)((*(long *)(this + 8) - *(long *)this) / 0x70); index = index + 1)
    {
      std::operator<<((ostream *)((long)msg.ss_.ptr_ + 0x10),"\n");
      pTVar1 = TestPartResultArray::GetTestPartResult(this,index);
      testing::operator<<((ostream *)((long)msg.ss_.ptr_ + 0x10),pTVar1);
    }
    local_58.success_ = false;
    local_58.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    pAVar2 = AssertionResult::operator<<(&local_58,&msg);
    AssertionResult::AssertionResult((AssertionResult *)param_1,pAVar2);
  }
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&local_58.message_);
LAB_00110ceb:
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr(&msg.ss_);
  std::__cxx11::string::~string((string *)&expected);
  AVar4.message_.ptr_ = extraout_RDX.ptr_;
  AVar4._0_8_ = param_1;
  return AVar4;
}

Assistant:

AssertionResult HasOneFailure(const char* /* results_expr */,
                              const char* /* type_expr */,
                              const char* /* substr_expr */,
                              const TestPartResultArray& results,
                              TestPartResult::Type type,
                              const string& substr) {
  const std::string expected(type == TestPartResult::kFatalFailure ?
                        "1 fatal failure" :
                        "1 non-fatal failure");
  Message msg;
  if (results.size() != 1) {
    msg << "Expected: " << expected << "\n"
        << "  Actual: " << results.size() << " failures";
    for (int i = 0; i < results.size(); i++) {
      msg << "\n" << results.GetTestPartResult(i);
    }
    return AssertionFailure() << msg;
  }

  const TestPartResult& r = results.GetTestPartResult(0);
  if (r.type() != type) {
    return AssertionFailure() << "Expected: " << expected << "\n"
                              << "  Actual:\n"
                              << r;
  }

  if (strstr(r.message(), substr.c_str()) == NULL) {
    return AssertionFailure() << "Expected: " << expected << " containing \""
                              << substr << "\"\n"
                              << "  Actual:\n"
                              << r;
  }

  return AssertionSuccess();
}